

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

void __thiscall QMdiArea::showEvent(QMdiArea *this,QShowEvent *showEvent)

{
  bool bVar1;
  int iVar2;
  QMdiAreaPrivate *this_00;
  const_iterator rearranger_00;
  Rearranger **ppRVar3;
  const_iterator o;
  QMdiSubWindowPrivate *pQVar4;
  QShowEvent *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QMdiSubWindow *window;
  QList<QPointer<QMdiSubWindow>_> *__range2_1;
  Rearranger *rearranger;
  QList<QMdi::Rearranger_*> *__range2;
  bool skipPlacement;
  QMdiAreaPrivate *d;
  QSize newSize;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  QList<QPointer<QMdiSubWindow>_> copy;
  const_iterator __end2;
  const_iterator __begin2;
  QList<QMdi::Rearranger_*> pendingRearrange;
  QWidget *in_stack_ffffffffffffff18;
  QMdiAreaPrivate *in_stack_ffffffffffffff20;
  QMdiAreaPrivate *in_stack_ffffffffffffff30;
  QMdiAreaPrivate *this_01;
  QMdiAreaPrivate *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  byte in_stack_ffffffffffffff57;
  QWidget *placer;
  QSize in_stack_ffffffffffffff70;
  const_iterator local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  Rearranger **local_38;
  const_iterator local_30;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  placer = in_RDI;
  this_00 = d_func((QMdiArea *)0x6147d5);
  bVar1 = QList<QMdi::Rearranger_*>::isEmpty((QList<QMdi::Rearranger_*> *)0x6147eb);
  if (!bVar1) {
    in_stack_ffffffffffffff57 = 0;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QList<QMdi::Rearranger_*>::QList
              ((QList<QMdi::Rearranger_*> *)in_stack_ffffffffffffff20,
               (QList<QMdi::Rearranger_*> *)in_stack_ffffffffffffff18);
    in_stack_ffffffffffffff48 = (QMdiAreaPrivate *)&local_20;
    rearranger_00 =
         QList<QMdi::Rearranger_*>::begin((QList<QMdi::Rearranger_*> *)in_stack_ffffffffffffff20);
    local_30.i = (Rearranger **)&DAT_aaaaaaaaaaaaaaaa;
    local_30 = QList<QMdi::Rearranger_*>::end
                         ((QList<QMdi::Rearranger_*> *)in_stack_ffffffffffffff20);
    while( true ) {
      local_38 = local_30.i;
      bVar1 = QList<QMdi::Rearranger_*>::const_iterator::operator!=
                        ((const_iterator *)&stack0xffffffffffffffd8,local_30);
      if (!bVar1) break;
      ppRVar3 = QList<QMdi::Rearranger_*>::const_iterator::operator*
                          ((const_iterator *)&stack0xffffffffffffffd8);
      iVar2 = (*(*ppRVar3)->_vptr_Rearranger[1])();
      if ((iVar2 != 2) && ((in_stack_ffffffffffffff57 & 1) == 0)) {
        in_stack_ffffffffffffff57 = 1;
      }
      QMdiAreaPrivate::rearrange(in_stack_ffffffffffffff48,(Rearranger *)rearranger_00.i);
      QList<QMdi::Rearranger_*>::const_iterator::operator++
                ((const_iterator *)&stack0xffffffffffffffd8);
    }
    QList<QMdi::Rearranger_*>::clear((QList<QMdi::Rearranger_*> *)in_stack_ffffffffffffff20);
    if (((in_stack_ffffffffffffff57 & 1) != 0) &&
       (bVar1 = QList<QPointer<QMdiSubWindow>_>::isEmpty
                          ((QList<QPointer<QMdiSubWindow>_> *)0x61493f), !bVar1)) {
      QList<QPointer<QMdiSubWindow>_>::clear
                ((QList<QPointer<QMdiSubWindow>_> *)in_stack_ffffffffffffff20);
    }
    QList<QMdi::Rearranger_*>::~QList((QList<QMdi::Rearranger_*> *)0x614961);
  }
  bVar1 = QList<QPointer<QMdiSubWindow>_>::isEmpty((QList<QPointer<QMdiSubWindow>_> *)0x614972);
  if (!bVar1) {
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    QList<QPointer<QMdiSubWindow>_>::QList
              ((QList<QPointer<QMdiSubWindow>_> *)in_stack_ffffffffffffff20,
               (QList<QPointer<QMdiSubWindow>_> *)in_stack_ffffffffffffff18);
    this_01 = (QMdiAreaPrivate *)&local_50;
    local_58.i = (QPointer<QMdiSubWindow> *)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = QList<QPointer<QMdiSubWindow>_>::begin
                         ((QList<QPointer<QMdiSubWindow>_> *)in_stack_ffffffffffffff20);
    o = QList<QPointer<QMdiSubWindow>_>::end
                  ((QList<QPointer<QMdiSubWindow>_> *)in_stack_ffffffffffffff20);
    while (bVar1 = QList<QPointer<QMdiSubWindow>_>::const_iterator::operator!=(&local_58,o), bVar1)
    {
      QList<QPointer<QMdiSubWindow>_>::const_iterator::operator*(&local_58);
      in_stack_ffffffffffffff30 =
           (QMdiAreaPrivate *)
           ::QPointer::operator_cast_to_QMdiSubWindow_((QPointer<QMdiSubWindow> *)0x614a61);
      if (in_stack_ffffffffffffff30 != (QMdiAreaPrivate *)0x0) {
        if (((this_00->viewMode != TabbedView) ||
            (pQVar4 = QMdiSubWindow::d_func((QMdiSubWindow *)0x614a8b), (pQVar4->isActive & 1U) == 0
            )) || (bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QMdiSubWindow> *)0x614aa5),
                  bVar1)) {
          bVar1 = QWidget::testAttribute
                            (in_RDI,(WidgetAttribute)((ulong)in_stack_ffffffffffffff20 >> 0x20));
          if (!bVar1) {
            (**(code **)(*(long *)&(in_stack_ffffffffffffff30->super_QAbstractScrollAreaPrivate).
                                   super_QFramePrivate.super_QWidgetPrivate + 0x70))();
            QAbstractScrollArea::viewport((QAbstractScrollArea *)in_stack_ffffffffffffff20);
            QWidget::size(in_stack_ffffffffffffff18);
            QSize::boundedTo((QSize *)in_RDI,(QSize *)in_stack_ffffffffffffff20);
            in_stack_ffffffffffffff20 = in_stack_ffffffffffffff30;
            in_stack_ffffffffffffff30 = in_stack_ffffffffffffff20;
            in_stack_ffffffffffffff70 = qSmartMinSize(in_stack_ffffffffffffff18);
            QSize::expandedTo((QSize *)in_RDI,(QSize *)in_stack_ffffffffffffff20);
            QWidget::resize((QWidget *)this_00,
                            (QSize *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
          }
          bVar1 = QWidget::testAttribute
                            (in_RDI,(WidgetAttribute)((ulong)in_stack_ffffffffffffff20 >> 0x20));
          if (((!bVar1) &&
              (bVar1 = QWidget::isMinimized((QWidget *)in_stack_ffffffffffffff30), !bVar1)) &&
             (bVar1 = QWidget::isMaximized((QWidget *)in_stack_ffffffffffffff30), !bVar1)) {
            QMdiAreaPrivate::place
                      ((QMdiAreaPrivate *)in_stack_ffffffffffffff70,(Placer *)placer,
                       (QMdiSubWindow *)in_RSI);
          }
        }
        else {
          this_00->showActiveWindowMaximized = true;
          QMdiAreaPrivate::emitWindowActivated(this_01,(QMdiSubWindow *)in_stack_ffffffffffffff48);
        }
      }
      QList<QPointer<QMdiSubWindow>_>::const_iterator::operator++(&local_58);
    }
    QList<QPointer<QMdiSubWindow>_>::clear
              ((QList<QPointer<QMdiSubWindow>_> *)in_stack_ffffffffffffff20);
    QList<QPointer<QMdiSubWindow>_>::~QList((QList<QPointer<QMdiSubWindow>_> *)0x614bdf);
  }
  QMdiAreaPrivate::setChildActivationEnabled
            (in_stack_ffffffffffffff30,SUB81((ulong)in_RDI >> 0x38,0),SUB81((ulong)in_RDI >> 0x30,0)
            );
  QMdiAreaPrivate::activateCurrentWindow(in_stack_ffffffffffffff20);
  QWidget::showEvent(in_RDI,in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiArea::showEvent(QShowEvent *showEvent)
{
    Q_D(QMdiArea);
    if (!d->pendingRearrangements.isEmpty()) {
        bool skipPlacement = false;
        // Take a copy because d->rearrange() may modify d->pendingRearrangements
        const auto pendingRearrange = d->pendingRearrangements;
        for (Rearranger *rearranger : pendingRearrange) {
            // If this is the case, we don't have to lay out pending child windows
            // since the rearranger will find a placement for them.
            if (rearranger->type() != Rearranger::IconTiler && !skipPlacement)
                skipPlacement = true;
            d->rearrange(rearranger);
        }
        d->pendingRearrangements.clear();

        if (skipPlacement && !d->pendingPlacements.isEmpty())
            d->pendingPlacements.clear();
    }

    if (!d->pendingPlacements.isEmpty()) {
        // Nothing obvious in the loop body changes the container (in this code path)
        // during iteration, this is calling into a non-const method that does change
        // the container when called from other places. So take a copy anyway for good
        // measure.
        const auto copy = d->pendingPlacements;
        for (QMdiSubWindow *window : copy) {
            if (!window)
                continue;
            if (d->viewMode == TabbedView && window->d_func()->isActive && !d->active) {
                d->showActiveWindowMaximized = true;
                d->emitWindowActivated(window); // Also maximizes the window
                continue;
            }
            if (!window->testAttribute(Qt::WA_Resized)) {
                QSize newSize(window->sizeHint().boundedTo(viewport()->size()));
                window->resize(newSize.expandedTo(qSmartMinSize(window)));
            }
            if (!window->testAttribute(Qt::WA_Moved) && !window->isMinimized()
                    && !window->isMaximized()) {
                d->place(d->placer, window);
            }
        }
        d->pendingPlacements.clear();
    }

    d->setChildActivationEnabled(true);
    d->activateCurrentWindow();

    QAbstractScrollArea::showEvent(showEvent);
}